

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O2

void aalcalcmeanonly::LoadPeriodToWeighting(void)

{
  double dVar1;
  FILE *__stream;
  size_t sVar2;
  mapped_type *pmVar3;
  Periods p;
  
  __stream = fopen("input/periods.bin","rb");
  if (__stream != (FILE *)0x0) {
    sVar2 = fread(&p,0xc,1,__stream);
    while (dVar1 = p.weighting, sVar2 != 0) {
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)periodToWeighting_,&p.period_no);
      *pmVar3 = dVar1;
      sVar2 = fread(&p,0xc,1,__stream);
    }
  }
  return;
}

Assistant:

void LoadPeriodToWeighting() {

    FILE* fin = fopen(PERIODS_FILE, "rb");
    if (fin == nullptr) return;

    Periods p;
    size_t i = fread(&p, sizeof(Periods), 1, fin);
    while (i != 0) {
      periodToWeighting_[p.period_no] = p.weighting;
      i = fread(&p, sizeof(Periods), 1, fin);
    }

  }